

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)> * __thiscall
testing::internal::ValuesInIteratorRangeGenerator<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>
::Iterator::Clone(Iterator *this)

{
  Iterator *this_00;
  Iterator *in_RDI;
  
  this_00 = (Iterator *)operator_new(0x20);
  Iterator(this_00,in_RDI);
  return &this_00->super_ParamIteratorInterface<void_(*)(const_int_*,_int,_int,_unsigned_char_*)>;
}

Assistant:

ParamIteratorInterface<T>* Clone() const override {
      return new Iterator(*this);
    }